

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxNode *args_1;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_2;
  PortDeclarationSyntax *pPVar1;
  DeepCloneVisitor visitor;
  Token local_40;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  args_1 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x50),(DeepCloneVisitor *)&local_40,
                      (BumpAllocator *)__child_stack);
  args_2 = deepClone<slang::syntax::DeclaratorSyntax>
                     ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)(__fn + 0x58),
                      (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x90),(BumpAllocator *)__child_stack);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::PortDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::PortHeaderSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,(PortHeaderSyntax *)args_1,args_2,
                      &local_40);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const PortDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<PortDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        *deepClone<PortHeaderSyntax>(*node.header, alloc),
        *deepClone(node.declarators, alloc),
        node.semi.deepClone(alloc)
    );
}